

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O2

void ImFontAtlasBuildPackCustomRects(ImFontAtlas *atlas,void *stbrp_context_opaque)

{
  ImFontAtlasCustomRect *pIVar1;
  undefined1 auVar2 [14];
  undefined1 auVar3 [14];
  undefined1 auVar4 [14];
  undefined1 auVar5 [14];
  ulong uVar6;
  stbrp_coord *psVar7;
  int *piVar8;
  long lVar9;
  ulong uVar10;
  int iVar11;
  long lVar12;
  ImVector<stbrp_rect> pack_rects;
  ImVector<stbrp_rect> local_28;
  
  local_28.Size = 0;
  local_28.Capacity = 0;
  local_28.Data = (stbrp_rect *)0x0;
  ImVector<stbrp_rect>::resize(&local_28,(atlas->CustomRects).Size);
  lVar12 = 0;
  memset(local_28.Data,0,(long)local_28.Size * 0x18);
  iVar11 = (atlas->CustomRects).Size;
  psVar7 = &(local_28.Data)->w;
  for (lVar9 = 0; lVar9 < iVar11; lVar9 = lVar9 + 1) {
    uVar6 = *(ulong *)((long)&((atlas->CustomRects).Data)->Width + lVar12);
    auVar2._8_4_ = 0;
    auVar2._0_8_ = uVar6;
    auVar2._12_2_ = (short)(uVar6 >> 0x30);
    auVar3._8_2_ = (short)(uVar6 >> 0x20);
    auVar3._0_8_ = uVar6;
    auVar3._10_4_ = auVar2._10_4_;
    auVar5._6_8_ = 0;
    auVar5._0_6_ = auVar3._8_6_;
    auVar4._6_8_ = SUB148(auVar5 << 0x40,6);
    auVar4._4_2_ = (short)(uVar6 >> 0x10);
    auVar4._2_2_ = 0;
    auVar4._0_2_ = (ushort)uVar6;
    *(long *)psVar7 = auVar4._0_8_;
    psVar7 = psVar7 + 6;
    lVar12 = lVar12 + 0x20;
  }
  stbrp_pack_rects((stbrp_context *)stbrp_context_opaque,local_28.Data,local_28.Size);
  uVar10 = 0;
  uVar6 = (ulong)(uint)local_28.Size;
  if (local_28.Size < 1) {
    uVar6 = uVar10;
  }
  piVar8 = &(local_28.Data)->was_packed;
  for (; uVar6 * 0x20 != uVar10; uVar10 = uVar10 + 0x20) {
    if (*piVar8 != 0) {
      pIVar1 = (atlas->CustomRects).Data;
      *(short *)((long)&pIVar1->X + uVar10) = (short)piVar8[-2];
      iVar11 = piVar8[-1];
      *(short *)((long)&pIVar1->Y + uVar10) = (short)iVar11;
      iVar11 = iVar11 + piVar8[-3];
      if (iVar11 < atlas->TexHeight) {
        iVar11 = atlas->TexHeight;
      }
      atlas->TexHeight = iVar11;
    }
    piVar8 = piVar8 + 6;
  }
  ImVector<stbrp_rect>::~ImVector(&local_28);
  return;
}

Assistant:

void ImFontAtlasBuildPackCustomRects(ImFontAtlas* atlas, void* stbrp_context_opaque)
{
    stbrp_context* pack_context = (stbrp_context*)stbrp_context_opaque;
    IM_ASSERT(pack_context != NULL);

    ImVector<ImFontAtlasCustomRect>& user_rects = atlas->CustomRects;
    IM_ASSERT(user_rects.Size >= 1); // We expect at least the default custom rects to be registered, else something went wrong.
#ifdef __GNUC__
    if (user_rects.Size < 1) { __builtin_unreachable(); } // Workaround for GCC bug if IM_ASSERT() is defined to conditionally throw (see #5343)
#endif

    ImVector<stbrp_rect> pack_rects;
    pack_rects.resize(user_rects.Size);
    memset(pack_rects.Data, 0, (size_t)pack_rects.size_in_bytes());
    for (int i = 0; i < user_rects.Size; i++)
    {
        pack_rects[i].w = user_rects[i].Width;
        pack_rects[i].h = user_rects[i].Height;
    }
    stbrp_pack_rects(pack_context, &pack_rects[0], pack_rects.Size);
    for (int i = 0; i < pack_rects.Size; i++)
        if (pack_rects[i].was_packed)
        {
            user_rects[i].X = (unsigned short)pack_rects[i].x;
            user_rects[i].Y = (unsigned short)pack_rects[i].y;
            IM_ASSERT(pack_rects[i].w == user_rects[i].Width && pack_rects[i].h == user_rects[i].Height);
            atlas->TexHeight = ImMax(atlas->TexHeight, pack_rects[i].y + pack_rects[i].h);
        }
}